

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
MapLoader::validateBordersLine
          (MapLoader *this,vector<int,_std::allocator<int>_> *lineNums,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryCount,bool verbose)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  size_type sVar3;
  ostream *poVar4;
  reference pbVar5;
  int local_1f4;
  stringstream local_1f0 [4];
  int x;
  stringstream parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool verbose_local;
  int *countryCount_local;
  bool *validMap_local;
  int *lineCount_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lineWords_local;
  vector<int,_std::allocator<int>_> *lineNums_local;
  MapLoader *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(lineWords);
  if (sVar3 < 2) {
    if (verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*lineCount);
      std::operator<<(poVar4,
                      " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
    this_local._7_1_ = 0;
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(lineWords);
    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(lineWords);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&s), bVar1) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_1f0,(string *)pbVar5,_Var2);
      local_1f4 = 0;
      std::istream::operator>>((istream *)local_1f0,&local_1f4);
      std::vector<int,_std::allocator<int>_>::push_back(lineNums,&local_1f4);
      if (*countryCount < local_1f4) {
        if (verbose) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Line ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*lineCount);
          std::operator<<(poVar4," - [ERROR] : a country or continent ID did was invalid.\n");
        }
        *validMap = false;
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::stringstream::~stringstream(local_1f0);
      if (bVar1) goto LAB_00134391;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = 1;
  }
LAB_00134391:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MapLoader::validateBordersLine(std::vector<int>* lineNums, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap, const int* countryCount, bool verbose) {
    //check validity of the line in this mode
    if (lineWords->size() < 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        //convert strings to ints
        for (auto& s : *lineWords) {
            std::stringstream parser(s);
            int x = 0;
            parser >> x;
            lineNums->push_back(x);
            //check that all countries referenced in this line exist
            if (x > *countryCount) {
                if(verbose){
                    std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
                }
                *validMap = false;
                return false;
            }
        }
        return true;
    }
}